

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

void bit_writer_write_1(bit_writer_t *w,uint8_t val)

{
  uint8_t val_local;
  bit_writer_t *w_local;
  
  w->current_byte = w->current_byte | val & 1;
  w->current_byte_len = w->current_byte_len + 1;
  if (w->current_byte_len == 8) {
    w->bytes[w->byte_index] = w->current_byte;
    w->byte_index = w->byte_index + 1;
    w->current_byte_len = 0;
    w->current_byte = '\0';
  }
  else {
    w->current_byte = w->current_byte << 1;
  }
  return;
}

Assistant:

void bit_writer_write_1(bit_writer_t *w, uint8_t val) {
    w->current_byte |= val & 1;
    w->current_byte_len++;

    if (w->current_byte_len == 8) {
        // 8 bits in a byte -- move to the next byte
        w->bytes[w->byte_index] = w->current_byte;
        w->byte_index++;
        w->current_byte_len = 0;
        w->current_byte = 0;
    } else {
        w->current_byte <<= 1;
    }
}